

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O2

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetMeasurementNoiseCovariance
          (DiscreteKalmanFilterHelper *this,MatrixDynSize *R)

{
  size_t sVar1;
  
  sVar1 = iDynTree::MatrixDynSize::rows();
  if ((sVar1 == this->m_dim_Y) && (sVar1 = iDynTree::MatrixDynSize::cols(), sVar1 == this->m_dim_Y))
  {
    iDynTree::MatrixDynSize::operator=(&this->m_R,R);
    this->m_measurement_noise_covariance_matrix_set = true;
    return true;
  }
  iDynTree::reportError
            ("DiscreteKalmanFilterHelper","kfSetMeasurementNoiseCovariance",
             "Could not set KF measurement noise covariance - dimension mismatch");
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetMeasurementNoiseCovariance(const iDynTree::MatrixDynSize& R)
{
    if ( (R.rows() != m_dim_Y) || (R.cols() != m_dim_Y))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetMeasurementNoiseCovariance", "Could not set KF measurement noise covariance - dimension mismatch");
        return false;
    }

    m_R = R;
    m_measurement_noise_covariance_matrix_set = true;
    return true;
}